

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-export.cc
# Opt level: O0

bool tinyusdz::tydra::export_to_obj
               (RenderScene *scene,int mesh_id,string *obj_str,string *mtl_str,string *warn,
               string *err)

{
  __node_base_ptr *pp_Var1;
  value_type vVar2;
  int iVar3;
  bool bVar4;
  ostream *poVar5;
  ulong uVar6;
  size_type sVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  size_type sVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  size_type sVar13;
  void *pvVar14;
  size_t sVar15;
  __node_base_ptr p_Var16;
  size_type sVar17;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>_>
  *this;
  vector<int,_std::allocator<int>_> *pvVar18;
  value_type *pvVar19;
  reference pvVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar21;
  size_type sVar22;
  mapped_type *pmVar23;
  reference pvVar24;
  const_reference pvVar25;
  long lVar26;
  type_conflict5 *ptVar27;
  uint *puVar28;
  const_reference pvVar29;
  const_reference pvVar30;
  const_reference pvVar31;
  size_type sVar32;
  uint local_53d0;
  uint local_53cc;
  string local_52f8 [36];
  float local_52d4;
  undefined1 local_52d0 [4];
  float f_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_52b0;
  allocator local_5289;
  string local_5288;
  string local_5268;
  ostringstream local_5248 [8];
  ostringstream ss_e_37;
  string local_50d0 [8];
  string texname_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5090;
  size_type local_5070;
  allocator local_5061;
  string local_5060 [32];
  string local_5040;
  ostringstream local_5020 [8];
  ostringstream ss_e_36;
  undefined1 local_4ea8 [8];
  int64_t imageId_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e80;
  size_type local_4e60;
  allocator local_4e51;
  string local_4e50 [32];
  string local_4e30;
  ostringstream local_4e10 [8];
  ostringstream ss_e_35;
  undefined1 local_4c98 [8];
  int32_t texId_10;
  float f_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c70;
  allocator local_4c49;
  string local_4c48;
  string local_4c28;
  ostringstream local_4c08 [8];
  ostringstream ss_e_34;
  string local_4a90 [8];
  string texname_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a50;
  size_type local_4a30;
  allocator local_4a21;
  string local_4a20 [32];
  string local_4a00;
  ostringstream local_49e0 [8];
  ostringstream ss_e_33;
  undefined1 local_4868 [8];
  int64_t imageId_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4840;
  size_type local_4820;
  allocator local_4811;
  string local_4810 [32];
  string local_47f0;
  ostringstream local_47d0 [8];
  ostringstream ss_e_32;
  undefined1 local_4658 [8];
  int32_t texId_9;
  float f_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4630;
  allocator local_4609;
  string local_4608;
  string local_45e8;
  ostringstream local_45c8 [8];
  ostringstream ss_e_31;
  string local_4450 [8];
  string texname_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4410;
  size_type local_43f0;
  allocator local_43e1;
  string local_43e0 [32];
  string local_43c0;
  ostringstream local_43a0 [8];
  ostringstream ss_e_30;
  undefined1 local_4228 [8];
  int64_t imageId_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4200;
  size_type local_41e0;
  allocator local_41d1;
  string local_41d0 [32];
  string local_41b0;
  ostringstream local_4190 [8];
  ostringstream ss_e_29;
  undefined1 local_4018 [8];
  int32_t texId_8;
  float f_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3ff0;
  allocator local_3fc9;
  string local_3fc8;
  string local_3fa8;
  ostringstream local_3f88 [8];
  ostringstream ss_e_28;
  string local_3e10 [8];
  string texname_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3dd0;
  size_type local_3db0;
  allocator local_3da1;
  string local_3da0 [32];
  string local_3d80;
  ostringstream local_3d60 [8];
  ostringstream ss_e_27;
  undefined1 local_3be8 [8];
  int64_t imageId_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3bc0;
  size_type local_3ba0;
  allocator local_3b91;
  string local_3b90 [32];
  string local_3b70;
  ostringstream local_3b50 [8];
  ostringstream ss_e_26;
  undefined1 local_39d8 [8];
  int32_t texId_7;
  float f_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_39b0;
  allocator local_3989;
  string local_3988;
  string local_3968;
  ostringstream local_3948 [8];
  ostringstream ss_e_25;
  string local_37d0 [8];
  string texname_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3790;
  size_type local_3770;
  allocator local_3761;
  string local_3760 [32];
  string local_3740;
  ostringstream local_3720 [8];
  ostringstream ss_e_24;
  undefined1 local_35a8 [8];
  int64_t imageId_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3580;
  size_type local_3560;
  allocator local_3551;
  string local_3550 [32];
  string local_3530;
  ostringstream local_3510 [8];
  ostringstream ss_e_23;
  undefined1 local_3398 [8];
  int32_t texId_6;
  float f_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3370;
  allocator local_3349;
  string local_3348;
  string local_3328;
  ostringstream local_3308 [8];
  ostringstream ss_e_22;
  string local_3190 [8];
  string texname_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3150;
  size_type local_3130;
  allocator local_3121;
  string local_3120 [32];
  string local_3100;
  ostringstream local_30e0 [8];
  ostringstream ss_e_21;
  undefined1 local_2f68 [8];
  int64_t imageId_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f40;
  size_type local_2f20;
  allocator local_2f11;
  string local_2f10 [32];
  string local_2ef0;
  ostringstream local_2ed0 [8];
  ostringstream ss_e_20;
  undefined1 local_2d58 [4];
  undefined1 auStack_2d54 [4];
  int32_t texId_5;
  array<float,_3UL> col_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d28;
  allocator local_2d01;
  string local_2d00;
  string local_2ce0;
  ostringstream local_2cc0 [8];
  ostringstream ss_e_19;
  string local_2b48 [8];
  string texname_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b08;
  size_type local_2ae8;
  allocator local_2ad9;
  string local_2ad8 [32];
  string local_2ab8;
  ostringstream local_2a98 [8];
  ostringstream ss_e_18;
  undefined1 local_2920 [8];
  int64_t imageId_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28f8;
  size_type local_28d8;
  allocator local_28c9;
  string local_28c8 [32];
  string local_28a8;
  ostringstream local_2888 [8];
  ostringstream ss_e_17;
  undefined1 local_2710 [8];
  int32_t texId_4;
  float f_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_26e8;
  allocator local_26c1;
  string local_26c0;
  string local_26a0;
  ostringstream local_2680 [8];
  ostringstream ss_e_16;
  string local_2508 [8];
  string texname_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24c8;
  size_type local_24a8;
  allocator local_2499;
  string local_2498 [32];
  string local_2478;
  ostringstream local_2458 [8];
  ostringstream ss_e_15;
  undefined1 local_22e0 [8];
  int64_t imageId_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22b8;
  size_type local_2298;
  allocator local_2289;
  string local_2288 [32];
  string local_2268;
  ostringstream local_2248 [8];
  ostringstream ss_e_14;
  undefined1 local_20d0 [8];
  int32_t texId_3;
  float f_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20a8;
  allocator local_2081;
  string local_2080;
  string local_2060;
  ostringstream local_2040 [8];
  ostringstream ss_e_13;
  string local_1ec8 [8];
  string texname_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e88;
  size_type local_1e68;
  allocator local_1e59;
  string local_1e58 [32];
  string local_1e38;
  ostringstream local_1e18 [8];
  ostringstream ss_e_12;
  undefined1 local_1ca0 [8];
  int64_t imageId_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c78;
  size_type local_1c58;
  allocator local_1c49;
  string local_1c48 [32];
  string local_1c28;
  ostringstream local_1c08 [8];
  ostringstream ss_e_11;
  undefined1 local_1a90 [4];
  undefined1 auStack_1a8c [4];
  int32_t texId_2;
  array<float,_3UL> col_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a60;
  allocator local_1a39;
  string local_1a38;
  string local_1a18;
  ostringstream local_19f8 [8];
  ostringstream ss_e_10;
  string local_1880 [8];
  string texname_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1840;
  size_type local_1820;
  allocator local_1811;
  string local_1810 [32];
  string local_17f0;
  ostringstream local_17d0 [8];
  ostringstream ss_e_9;
  undefined1 local_1658 [8];
  int64_t imageId_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1630;
  size_type local_1610;
  allocator local_1601;
  string local_1600 [32];
  string local_15e0;
  ostringstream local_15c0 [8];
  ostringstream ss_e_8;
  undefined1 local_1448 [4];
  undefined1 auStack_1444 [4];
  int32_t texId_1;
  array<float,_3UL> col;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1418;
  allocator local_13f1;
  string local_13f0;
  string local_13d0;
  ostringstream local_13b0 [8];
  ostringstream ss_e_7;
  string local_1238 [8];
  string texname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11f8;
  size_type local_11d8;
  allocator local_11c9;
  string local_11c8 [32];
  string local_11a8;
  ostringstream local_1188 [8];
  ostringstream ss_e_6;
  undefined1 local_1010 [8];
  int64_t imageId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe8;
  size_type local_fc8;
  allocator local_fb9;
  string local_fb8 [32];
  string local_f98;
  ostringstream local_f78 [8];
  ostringstream ss_e_5;
  undefined1 local_e00 [8];
  int32_t texId;
  uint32_t mat_id_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *group_1;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  *__range2_1;
  string local_dd0 [32];
  string local_db0 [36];
  uint local_d8c;
  uint local_d88;
  uint32_t n_idx;
  uint32_t t_idx;
  uint32_t idx;
  size_t f;
  size_t i_7;
  type *face_ids_3;
  reference ppStack_d60;
  uint32_t mat_id;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *group;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  *__range2;
  size_t faceIndexOffset;
  size_t i_6;
  size_t offset;
  undefined1 local_d20 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  key_type local_d00;
  pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_ce0;
  uint *local_cc0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_cb8;
  allocator<unsigned_int> local_ca9;
  undefined1 local_ca8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> face_ids_2;
  key_type local_c88;
  pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_c68;
  value_type_conflict3 local_c48;
  key_type local_c44;
  ulong local_c40;
  size_t i_5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> face_ids;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  ostringstream local_bc0 [8];
  ostringstream ss_e_4;
  ulong local_a38;
  size_t i_4;
  undefined1 local_a28 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> face_ids_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>
  *subset;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>_>
  *__range3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  subset_face_ids;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  face_groups;
  size_t i_3;
  float *ptr_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  ostringstream local_930 [8];
  ostringstream ss_e_3;
  ulong local_7b8;
  size_t i_2;
  float *ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  ostringstream local_768 [8];
  ostringstream ss_e_2;
  key_type local_5ec;
  mapped_type *local_5e8;
  VertexAttribute *texcoord;
  bool is_facevarying_normal;
  bool has_normal;
  bool is_facevarying_texcoord;
  ulong uStack_5d8;
  bool has_texcoord;
  size_t w;
  size_t i_1;
  size_t elementSize;
  size_t i;
  const_reference local_598;
  RenderMesh *mesh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  size_type local_550;
  allocator local_541;
  string local_540 [32];
  string local_520;
  ostringstream local_500 [8];
  ostringstream ss_e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  ostringstream local_340 [8];
  ostringstream ss_e;
  stringstream local_1c8 [8];
  stringstream ss;
  ostream aoStack_1b8 [376];
  string *local_40;
  string *err_local;
  string *warn_local;
  string *mtl_str_local;
  string *obj_str_local;
  RenderScene *pRStack_18;
  int mesh_id_local;
  RenderScene *scene_local;
  
  local_40 = err;
  err_local = warn;
  warn_local = mtl_str;
  mtl_str_local = obj_str;
  obj_str_local._4_4_ = mesh_id;
  pRStack_18 = scene;
  ::std::__cxx11::stringstream::stringstream(local_1c8);
  if (obj_str_local._4_4_ < 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_340);
    poVar5 = ::std::operator<<((ostream *)local_340,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"export_to_obj");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x26);
    ::std::operator<<(poVar5," ");
    poVar5 = ::std::operator<<((ostream *)local_340,"Invalid mesh_id");
    ::std::operator<<(poVar5,"\n");
    if (local_40 != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::operator+(&local_360,&local_380,"\n");
      ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_360);
      ::std::__cxx11::string::~string((string *)&local_360);
      ::std::__cxx11::string::~string((string *)&local_380);
    }
    scene_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_340);
    goto LAB_00482eed;
  }
  uVar6 = (ulong)obj_str_local._4_4_;
  sVar7 = ::std::vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
          size(&pRStack_18->meshes);
  if (sVar7 <= uVar6) {
    ::std::__cxx11::ostringstream::ostringstream(local_500);
    poVar5 = ::std::operator<<((ostream *)local_500,"[error]");
    poVar5 = ::std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                              );
    poVar5 = ::std::operator<<(poVar5,":");
    poVar5 = ::std::operator<<(poVar5,"export_to_obj");
    poVar5 = ::std::operator<<(poVar5,"():");
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x28);
    ::std::operator<<(poVar5," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_540,"mesh_id {} is out-of-range. scene.meshes.size {}",&local_541);
    local_550 = ::std::
                vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
                size(&pRStack_18->meshes);
    fmt::format<int,unsigned_long>
              (&local_520,(fmt *)local_540,(string *)((long)&obj_str_local + 4),(int *)&local_550,
               (unsigned_long *)warn);
    poVar5 = ::std::operator<<((ostream *)local_500,(string *)&local_520);
    ::std::operator<<(poVar5,"\n");
    ::std::__cxx11::string::~string((string *)&local_520);
    ::std::__cxx11::string::~string(local_540);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_541);
    if (local_40 != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::operator+(&local_570,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mesh,
                       "\n");
      ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_570);
      ::std::__cxx11::string::~string((string *)&local_570);
      ::std::__cxx11::string::~string((string *)&mesh);
    }
    scene_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_500);
    goto LAB_00482eed;
  }
  local_598 = ::std::
              vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
              operator[](&pRStack_18->meshes,(long)obj_str_local._4_4_);
  ::std::operator<<(aoStack_1b8,"# exported from TinyUSDZ Tydra.\n");
  poVar5 = ::std::operator<<(aoStack_1b8,"mtllib ");
  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,obj_str_local._4_4_);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                   (char *)local_598);
  ::std::operator<<(poVar5,(string *)&i);
  ::std::__cxx11::string::~string((string *)&i);
  ::std::operator<<(aoStack_1b8,"\n");
  for (elementSize = 0; sVar15 = elementSize,
      sVar7 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::size
                        (&local_598->points), sVar15 < sVar7; elementSize = elementSize + 1) {
    poVar5 = ::std::operator<<(aoStack_1b8,"v ");
    pvVar8 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
             operator[](&local_598->points,elementSize);
    pvVar9 = ::std::array<float,_3UL>::operator[](pvVar8,0);
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
    poVar5 = ::std::operator<<(poVar5," ");
    pvVar8 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
             operator[](&local_598->points,elementSize);
    pvVar9 = ::std::array<float,_3UL>::operator[](pvVar8,1);
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
    poVar5 = ::std::operator<<(poVar5," ");
    pvVar8 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
             operator[](&local_598->points,elementSize);
    pvVar9 = ::std::array<float,_3UL>::operator[](pvVar8,2);
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
    ::std::operator<<(poVar5,"\n");
  }
  poVar5 = ::std::operator<<(aoStack_1b8,"# ");
  sVar7 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::size
                    (&local_598->points);
  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,sVar7);
  ::std::operator<<(poVar5," vertices\n");
  sVar7 = ::std::vector<float,_std::allocator<float>_>::size
                    (&(local_598->joint_and_weights).jointWeights);
  sVar10 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::size
                     (&local_598->points);
  if (sVar7 == sVar10 * (long)(local_598->joint_and_weights).elementSize) {
    i_1 = (size_t)(local_598->joint_and_weights).elementSize;
    for (w = 0; sVar15 = w,
        sVar7 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                size(&local_598->points), sVar15 < sVar7; w = w + 1) {
      ::std::operator<<(aoStack_1b8,"vw ");
      for (uStack_5d8 = 0; uStack_5d8 < i_1; uStack_5d8 = uStack_5d8 + 1) {
        if (uStack_5d8 != 0) {
          ::std::operator<<(aoStack_1b8," ");
        }
        pvVar11 = ::std::vector<int,_std::allocator<int>_>::operator[]
                            (&(local_598->joint_and_weights).jointIndices,w * i_1 + uStack_5d8);
        poVar5 = (ostream *)::std::ostream::operator<<(aoStack_1b8,*pvVar11);
        poVar5 = ::std::operator<<(poVar5," ");
        pvVar12 = ::std::vector<float,_std::allocator<float>_>::operator[]
                            (&(local_598->joint_and_weights).jointWeights,w * i_1 + uStack_5d8);
        ::std::ostream::operator<<(poVar5,*pvVar12);
      }
      ::std::operator<<(aoStack_1b8,"\n");
    }
  }
  texcoord._7_1_ = 0;
  texcoord._6_1_ = 0;
  texcoord._5_1_ = 0;
  texcoord._4_1_ = 0;
  texcoord._0_4_ = 0;
  sVar13 = ::std::
           unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
           ::count(&local_598->texcoords,(key_type *)&texcoord);
  if (sVar13 != 0) {
    local_5ec = 0;
    local_5e8 = ::std::
                unordered_map<unsigned_int,_tinyusdz::tydra::VertexAttribute,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>_>
                ::at(&local_598->texcoords,&local_5ec);
    if (local_5e8->variability == FaceVarying) {
      texcoord._6_1_ = 1;
    }
    else {
      if (local_5e8->variability != Vertex) {
        ::std::__cxx11::ostringstream::ostringstream(local_768);
        poVar5 = ::std::operator<<((ostream *)local_768,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"export_to_obj");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x52);
        ::std::operator<<(poVar5," ");
        poVar5 = ::std::operator<<((ostream *)local_768,
                                   "Vertex variability must be either \'vertex\' or \'facevarying\' for texcoord0"
                                  );
        ::std::operator<<(poVar5,"\n");
        if (local_40 != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(&local_788,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ptr
                           ,"\n");
          ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_788);
          ::std::__cxx11::string::~string((string *)&local_788);
          ::std::__cxx11::string::~string((string *)&ptr);
        }
        scene_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_768);
        goto LAB_00482eed;
      }
      texcoord._6_1_ = 0;
    }
    if (local_5e8->format == Vec2) {
      pvVar14 = VertexAttribute::buffer(local_5e8);
      for (local_7b8 = 0; sVar15 = VertexAttribute::vertex_count(local_5e8), local_7b8 < sVar15;
          local_7b8 = local_7b8 + 1) {
        poVar5 = ::std::operator<<(aoStack_1b8,"vt ");
        poVar5 = (ostream *)
                 ::std::ostream::operator<<(poVar5,*(float *)((long)pvVar14 + local_7b8 * 8));
        poVar5 = ::std::operator<<(poVar5," ");
        poVar5 = (ostream *)
                 ::std::ostream::operator<<(poVar5,*(float *)((long)pvVar14 + local_7b8 * 8 + 4));
        ::std::operator<<(poVar5,"\n");
      }
      texcoord._7_1_ = 1;
    }
  }
  bVar4 = VertexAttribute::empty(&local_598->normals);
  if (!bVar4) {
    if ((local_598->normals).variability == FaceVarying) {
      texcoord._4_1_ = 1;
    }
    else {
      if ((local_598->normals).variability != Vertex) {
        ::std::__cxx11::ostringstream::ostringstream(local_930);
        poVar5 = ::std::operator<<((ostream *)local_930,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"export_to_obj");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,100);
        ::std::operator<<(poVar5," ");
        poVar5 = ::std::operator<<((ostream *)local_930,
                                   "Vertex variability must be either \'vertex\' or \'facevarying\' for texcoord0"
                                  );
        ::std::operator<<(poVar5,"\n");
        if (local_40 != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(&local_950,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ptr_1,"\n");
          ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_950);
          ::std::__cxx11::string::~string((string *)&local_950);
          ::std::__cxx11::string::~string((string *)&ptr_1);
        }
        scene_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_930);
        goto LAB_00482eed;
      }
      texcoord._4_1_ = 0;
    }
    if ((local_598->normals).format == Vec3) {
      pvVar14 = VertexAttribute::buffer(&local_598->normals);
      for (face_groups._M_h._M_single_bucket = (__node_base_ptr)0x0;
          p_Var16 = (__node_base_ptr)VertexAttribute::vertex_count(&local_598->normals),
          face_groups._M_h._M_single_bucket < p_Var16;
          face_groups._M_h._M_single_bucket =
               (__node_base_ptr)((long)&(face_groups._M_h._M_single_bucket)->_M_nxt + 1)) {
        poVar5 = ::std::operator<<(aoStack_1b8,"vn ");
        poVar5 = (ostream *)
                 ::std::ostream::operator<<
                           (poVar5,*(float *)((long)pvVar14 +
                                             (long)face_groups._M_h._M_single_bucket * 0xc));
        poVar5 = ::std::operator<<(poVar5," ");
        poVar5 = (ostream *)
                 ::std::ostream::operator<<
                           (poVar5,*(float *)((long)pvVar14 +
                                             (long)face_groups._M_h._M_single_bucket * 0xc + 4));
        poVar5 = ::std::operator<<(poVar5," ");
        poVar5 = (ostream *)
                 ::std::ostream::operator<<
                           (poVar5,*(float *)((long)pvVar14 +
                                             (long)face_groups._M_h._M_single_bucket * 0xc + 8));
        ::std::operator<<(poVar5,"\n");
      }
      texcoord._5_1_ = 1;
    }
  }
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   *)&subset_face_ids._M_h._M_single_bucket);
  sVar17 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>_>
           ::size(&local_598->material_subsetMap);
  if (sVar17 == 0) {
    pvVar21 = RenderMesh::faceVertexCounts(local_598);
    sVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar21);
    ::std::allocator<unsigned_int>::allocator(&local_ca9);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ca8,sVar7,&local_ca9);
    ::std::allocator<unsigned_int>::~allocator(&local_ca9);
    local_cb8._M_current =
         (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ca8);
    local_cc0 = (uint *)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ca8)
    ;
    ::std::
    iota<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
              (local_cb8,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )local_cc0,0);
    ::std::make_pair<int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>&>
              (&local_ce0,&local_598->material_id,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ca8);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_d00,"",
               (allocator *)
               ((long)&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pmVar23 = ::std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            *)&subset_face_ids._M_h._M_single_bucket,&local_d00);
    ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator=
              (pmVar23,&local_ce0);
    ::std::__cxx11::string::~string((string *)&local_d00);
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~pair(&local_ce0);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_ca8);
LAB_0047dd6c:
    pvVar21 = RenderMesh::faceVertexCounts(local_598);
    sVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar21);
    ::std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&offset + 7));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d20,sVar7,
               (allocator_type *)((long)&offset + 7));
    ::std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&offset + 7));
    i_6 = 0;
    faceIndexOffset = 0;
    while( true ) {
      pvVar21 = RenderMesh::faceVertexCounts(local_598);
      sVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar21);
      if (sVar7 <= faceIndexOffset) break;
      pvVar24 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d20,
                           faceIndexOffset);
      *pvVar24 = i_6;
      pvVar21 = RenderMesh::faceVertexCounts(local_598);
      pvVar25 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar21,faceIndexOffset);
      i_6 = *pvVar25 + i_6;
      faceIndexOffset = faceIndexOffset + 1;
    }
    __range2 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                *)0x0;
    pp_Var1 = &subset_face_ids._M_h._M_single_bucket;
    __end2 = ::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                      *)pp_Var1);
    group = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                      *)pp_Var1);
    while (bVar4 = ::std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_true>
                                *)&group), bVar4) {
      ppStack_d60 = ::std::__detail::
                    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_false,_true>
                    ::operator*(&__end2);
      lVar26 = ::std::__cxx11::string::size();
      if (lVar26 != 0) {
        poVar5 = ::std::operator<<(aoStack_1b8,"g ");
        poVar5 = ::std::operator<<(poVar5,(string *)ppStack_d60);
        ::std::operator<<(poVar5,"\n");
      }
      ptVar27 = ::std::get<0ul,int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&ppStack_d60->second);
      if (-1 < *ptVar27) {
        puVar28 = (uint *)::std::get<0ul,int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                    (&ppStack_d60->second);
        face_ids_3._4_4_ = *puVar28;
        poVar5 = ::std::operator<<(aoStack_1b8,"usemtl ");
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)face_ids_3._4_4_);
        poVar5 = ::std::operator<<(poVar5,(string *)pvVar29);
        ::std::operator<<(poVar5,"\n");
      }
      i_7 = (size_t)::std::get<1ul,int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                              (&ppStack_d60->second);
      for (f = 0; sVar15 = f,
          sVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)i_7),
          sVar15 < sVar7; f = f + 1) {
        ::std::operator<<(aoStack_1b8,"f ");
        _t_idx = 0;
        while( true ) {
          uVar6 = _t_idx;
          pvVar21 = RenderMesh::faceVertexCounts(local_598);
          pvVar25 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)i_7,f);
          pvVar25 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar21,(ulong)*pvVar25);
          if (*pvVar25 <= uVar6) break;
          if (_t_idx != 0) {
            ::std::operator<<(aoStack_1b8," ");
          }
          pvVar21 = RenderMesh::faceVertexIndices(local_598);
          pvVar25 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)i_7,f);
          pvVar24 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d20,
                               (ulong)*pvVar25);
          pvVar25 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (pvVar21,*pvVar24 + _t_idx);
          n_idx = *pvVar25 + 1;
          local_53cc = n_idx;
          if ((texcoord._6_1_ & 1) != 0) {
            local_53cc = (int)__range2 + (int)_t_idx;
          }
          local_d88 = local_53cc;
          local_53d0 = n_idx;
          if ((texcoord._4_1_ & 1) != 0) {
            local_53d0 = (int)__range2 + (int)_t_idx;
          }
          local_d8c = local_53d0;
          if (((texcoord._7_1_ & 1) == 0) || ((texcoord._5_1_ & 1) == 0)) {
            if ((texcoord._7_1_ & 1) == 0) {
              if ((texcoord._5_1_ & 1) == 0) {
                ::std::ostream::operator<<(aoStack_1b8,n_idx);
              }
              else {
                poVar5 = (ostream *)::std::ostream::operator<<(aoStack_1b8,n_idx);
                poVar5 = ::std::operator<<(poVar5,"//");
                ::std::ostream::operator<<(poVar5,local_d8c);
              }
            }
            else {
              poVar5 = (ostream *)::std::ostream::operator<<(aoStack_1b8,n_idx);
              poVar5 = ::std::operator<<(poVar5,"/");
              ::std::ostream::operator<<(poVar5,local_d88);
            }
          }
          else {
            poVar5 = (ostream *)::std::ostream::operator<<(aoStack_1b8,n_idx);
            poVar5 = ::std::operator<<(poVar5,"/");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,local_d88);
            poVar5 = ::std::operator<<(poVar5,"/");
            ::std::ostream::operator<<(poVar5,local_d8c);
          }
          _t_idx = _t_idx + 1;
        }
        pvVar21 = RenderMesh::faceVertexIndices(local_598);
        pvVar25 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)i_7,f);
        pvVar25 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (pvVar21,(ulong)*pvVar25);
        __range2 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    *)((long)&(__range2->_M_h)._M_buckets + (ulong)*pvVar25);
        ::std::operator<<(aoStack_1b8,"\n");
      }
      ::std::operator<<(aoStack_1b8,"\n");
      ::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_false,_true>
      ::operator++(&__end2);
    }
    ::std::__cxx11::stringstream::str();
    ::std::__cxx11::string::operator=((string *)mtl_str_local,local_db0);
    ::std::__cxx11::string::~string(local_db0);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_dd0,"",(allocator *)((long)&__range2_1 + 7));
    ::std::__cxx11::stringstream::str((string *)local_1c8);
    ::std::__cxx11::string::~string(local_dd0);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
    ::std::operator<<(aoStack_1b8,"# exported from TinyUSDZ Tydra.\n");
    pp_Var1 = &subset_face_ids._M_h._M_single_bucket;
    __end2_1 = ::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
               ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                        *)pp_Var1);
    group_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)::std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                        *)pp_Var1);
    while (bVar4 = ::std::__detail::operator!=
                             (&__end2_1.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_true>
                                *)&group_1), bVar4) {
      _texId = ::std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_false,_true>
               ::operator*(&__end2_1);
      if ((_texId->second).first != -1) {
        puVar28 = (uint *)::std::get<0ul,int,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                    (&_texId->second);
        local_e00._4_4_ = *puVar28;
        poVar5 = ::std::operator<<(aoStack_1b8,"newmtl ");
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        poVar5 = ::std::operator<<(poVar5,(string *)pvVar29);
        ::std::operator<<(poVar5,"\n");
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        bVar4 = ShaderParam<std::array<float,_3UL>_>::is_texture
                          (&(pvVar29->surfaceShader).diffuseColor);
        if (bVar4) {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          iVar3 = (pvVar29->surfaceShader).diffuseColor.texture_id;
          local_e00._0_4_ = iVar3;
          if ((iVar3 < 0) ||
             (sVar7 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
            ::std::__cxx11::ostringstream::ostringstream(local_f78);
            poVar5 = ::std::operator<<((ostream *)local_f78,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xda);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_fb8,"Invalid texture id {}. scene.textures.size = {}",&local_fb9);
            local_fc8 = ::std::
                        vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                        ::size(&pRStack_18->textures);
            fmt::format<int,unsigned_long>
                      (&local_f98,(fmt *)local_fb8,(string *)local_e00,(int *)&local_fc8,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_f78,(string *)&local_f98);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_f98);
            ::std::__cxx11::string::~string(local_fb8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_fb9);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_fe8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imageId,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_fe8);
              ::std::__cxx11::string::~string((string *)&local_fe8);
              ::std::__cxx11::string::~string((string *)&imageId);
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_f78);
            goto LAB_00482ed5;
          }
          pvVar30 = ::std::
                    vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                    ::operator[](&pRStack_18->textures,(long)(int)local_e00._0_4_);
          sVar7 = pvVar30->texture_image_id;
          local_1010 = (undefined1  [8])sVar7;
          if (((long)sVar7 < 0) ||
             (sVar10 = ::std::
                       vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                       ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
            ::std::__cxx11::ostringstream::ostringstream(local_1188);
            poVar5 = ::std::operator<<((ostream *)local_1188,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xdf);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_11c8,"Invalid image id {}. scene.images.size = {}",&local_11c9);
            local_11d8 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images);
            fmt::format<long,unsigned_long>
                      (&local_11a8,(fmt *)local_11c8,(string *)local_1010,(long *)&local_11d8,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_1188,(string *)&local_11a8);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_11a8);
            ::std::__cxx11::string::~string(local_11c8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_11c9);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_11f8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&texname.field_2 + 8),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_11f8);
              ::std::__cxx11::string::~string((string *)&local_11f8);
              ::std::__cxx11::string::~string((string *)(texname.field_2._M_local_buf + 8));
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_1188);
            goto LAB_00482ed5;
          }
          pvVar31 = ::std::
                    vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                    ::operator[](&pRStack_18->images,(size_type)local_1010);
          ::std::__cxx11::string::string(local_1238,(string *)pvVar31);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar5 = ::std::operator<<(aoStack_1b8,"map_Kd ");
            poVar5 = ::std::operator<<(poVar5,local_1238);
            ::std::operator<<(poVar5,"\n");
            bVar4 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_13b0);
            poVar5 = ::std::operator<<((ostream *)local_13b0,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xe4);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_13f0,"Filename for image id {} is empty.",&local_13f1);
            fmt::format<long>(&local_13d0,&local_13f0,(long *)local_1010);
            poVar5 = ::std::operator<<((ostream *)local_13b0,(string *)&local_13d0);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_13d0);
            ::std::__cxx11::string::~string((string *)&local_13f0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_13f1);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_1418,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (col._M_elems + 1),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_1418);
              ::std::__cxx11::string::~string((string *)&local_1418);
              ::std::__cxx11::string::~string((string *)(col._M_elems + 1));
            }
            scene_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_13b0);
          }
          ::std::__cxx11::string::~string(local_1238);
          if (bVar4) goto LAB_00482ed5;
        }
        else {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          _auStack_1444 = *(undefined8 *)(pvVar29->surfaceShader).diffuseColor.value._M_elems;
          col._M_elems[0] = (pvVar29->surfaceShader).diffuseColor.value._M_elems[2];
          poVar5 = ::std::operator<<(aoStack_1b8,"Kd ");
          pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)auStack_1444,0);
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
          poVar5 = ::std::operator<<(poVar5," ");
          pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)auStack_1444,1);
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
          poVar5 = ::std::operator<<(poVar5," ");
          pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)auStack_1444,2);
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
          ::std::operator<<(poVar5,"\n");
        }
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        if (((pvVar29->surfaceShader).useSpecularWorkflow & 1U) == 0) {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          bVar4 = ShaderParam<float>::is_texture(&(pvVar29->surfaceShader).metallic);
          if (bVar4) {
            pvVar29 = ::std::
                      vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                      ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
            iVar3 = (pvVar29->surfaceShader).metallic.texture_id;
            local_1a90 = (undefined1  [4])iVar3;
            if ((iVar3 < 0) ||
               (sVar7 = ::std::
                        vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                        ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
              ::std::__cxx11::ostringstream::ostringstream(local_1c08);
              poVar5 = ::std::operator<<((ostream *)local_1c08,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"export_to_obj");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x106);
              ::std::operator<<(poVar5," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1c48,"Invalid texture id {}. scene.textures.size = {}",&local_1c49);
              local_1c58 = ::std::
                           vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                           ::size(&pRStack_18->textures);
              fmt::format<int,unsigned_long>
                        (&local_1c28,(fmt *)local_1c48,(string *)local_1a90,(int *)&local_1c58,
                         (unsigned_long *)warn);
              poVar5 = ::std::operator<<((ostream *)local_1c08,(string *)&local_1c28);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::~string((string *)&local_1c28);
              ::std::__cxx11::string::~string(local_1c48);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1c49);
              if (local_40 != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(&local_1c78,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&imageId_2,"\n");
                ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_1c78);
                ::std::__cxx11::string::~string((string *)&local_1c78);
                ::std::__cxx11::string::~string((string *)&imageId_2);
              }
              scene_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_1c08);
              goto LAB_00482ed5;
            }
            pvVar30 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::operator[](&pRStack_18->textures,(long)(int)local_1a90);
            sVar7 = pvVar30->texture_image_id;
            local_1ca0 = (undefined1  [8])sVar7;
            if (((long)sVar7 < 0) ||
               (sVar10 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
              ::std::__cxx11::ostringstream::ostringstream(local_1e18);
              poVar5 = ::std::operator<<((ostream *)local_1e18,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"export_to_obj");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x10b);
              ::std::operator<<(poVar5," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1e58,"Invalid image id {}. scene.images.size = {}",&local_1e59);
              local_1e68 = ::std::
                           vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                           ::size(&pRStack_18->images);
              fmt::format<long,unsigned_long>
                        (&local_1e38,(fmt *)local_1e58,(string *)local_1ca0,(long *)&local_1e68,
                         (unsigned_long *)warn);
              poVar5 = ::std::operator<<((ostream *)local_1e18,(string *)&local_1e38);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::~string((string *)&local_1e38);
              ::std::__cxx11::string::~string(local_1e58);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1e59);
              if (local_40 != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(&local_1e88,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&texname_2.field_2 + 8),"\n");
                ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_1e88);
                ::std::__cxx11::string::~string((string *)&local_1e88);
                ::std::__cxx11::string::~string((string *)(texname_2.field_2._M_local_buf + 8));
              }
              scene_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_1e18);
              goto LAB_00482ed5;
            }
            pvVar31 = ::std::
                      vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                      ::operator[](&pRStack_18->images,(size_type)local_1ca0);
            ::std::__cxx11::string::string(local_1ec8,(string *)pvVar31);
            uVar6 = ::std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              poVar5 = ::std::operator<<(aoStack_1b8,"map_Pm ");
              poVar5 = ::std::operator<<(poVar5,local_1ec8);
              ::std::operator<<(poVar5,"\n");
              bVar4 = false;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_2040);
              poVar5 = ::std::operator<<((ostream *)local_2040,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"export_to_obj");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x110);
              ::std::operator<<(poVar5," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_2080,"Filename for image id {} is empty.",&local_2081);
              fmt::format<long>(&local_2060,&local_2080,(long *)local_1ca0);
              poVar5 = ::std::operator<<((ostream *)local_2040,(string *)&local_2060);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::~string((string *)&local_2060);
              ::std::__cxx11::string::~string((string *)&local_2080);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_2081);
              if (local_40 != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(&local_20a8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&texId_3,"\n");
                ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_20a8);
                ::std::__cxx11::string::~string((string *)&local_20a8);
                ::std::__cxx11::string::~string((string *)&texId_3);
              }
              scene_local._7_1_ = 0;
              bVar4 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_2040);
            }
            ::std::__cxx11::string::~string(local_1ec8);
            if (bVar4) goto LAB_00482ed5;
          }
          else {
            pvVar29 = ::std::
                      vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                      ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
            local_20d0._4_4_ = (pvVar29->surfaceShader).metallic.value;
            poVar5 = ::std::operator<<(aoStack_1b8,"Pm ");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,(float)local_20d0._4_4_);
            ::std::operator<<(poVar5,"\n");
          }
        }
        else {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          bVar4 = ShaderParam<std::array<float,_3UL>_>::is_texture
                            (&(pvVar29->surfaceShader).specularColor);
          if (bVar4) {
            pvVar29 = ::std::
                      vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                      ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
            iVar3 = (pvVar29->surfaceShader).specularColor.texture_id;
            local_1448 = (undefined1  [4])iVar3;
            if ((iVar3 < 0) ||
               (sVar7 = ::std::
                        vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                        ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
              ::std::__cxx11::ostringstream::ostringstream(local_15c0);
              poVar5 = ::std::operator<<((ostream *)local_15c0,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"export_to_obj");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf0);
              ::std::operator<<(poVar5," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1600,"Invalid texture id {}. scene.textures.size = {}",&local_1601);
              local_1610 = ::std::
                           vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                           ::size(&pRStack_18->textures);
              fmt::format<int,unsigned_long>
                        (&local_15e0,(fmt *)local_1600,(string *)local_1448,(int *)&local_1610,
                         (unsigned_long *)warn);
              poVar5 = ::std::operator<<((ostream *)local_15c0,(string *)&local_15e0);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::~string((string *)&local_15e0);
              ::std::__cxx11::string::~string(local_1600);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1601);
              if (local_40 != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(&local_1630,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&imageId_1,"\n");
                ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_1630);
                ::std::__cxx11::string::~string((string *)&local_1630);
                ::std::__cxx11::string::~string((string *)&imageId_1);
              }
              scene_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_15c0);
              goto LAB_00482ed5;
            }
            pvVar30 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::operator[](&pRStack_18->textures,(long)(int)local_1448);
            sVar7 = pvVar30->texture_image_id;
            local_1658 = (undefined1  [8])sVar7;
            if (((long)sVar7 < 0) ||
               (sVar10 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
              ::std::__cxx11::ostringstream::ostringstream(local_17d0);
              poVar5 = ::std::operator<<((ostream *)local_17d0,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"export_to_obj");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xf5);
              ::std::operator<<(poVar5," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_1810,"Invalid image id {}. scene.images.size = {}",&local_1811);
              local_1820 = ::std::
                           vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                           ::size(&pRStack_18->images);
              fmt::format<long,unsigned_long>
                        (&local_17f0,(fmt *)local_1810,(string *)local_1658,(long *)&local_1820,
                         (unsigned_long *)warn);
              poVar5 = ::std::operator<<((ostream *)local_17d0,(string *)&local_17f0);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::~string((string *)&local_17f0);
              ::std::__cxx11::string::~string(local_1810);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1811);
              if (local_40 != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(&local_1840,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&texname_1.field_2 + 8),"\n");
                ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_1840);
                ::std::__cxx11::string::~string((string *)&local_1840);
                ::std::__cxx11::string::~string((string *)(texname_1.field_2._M_local_buf + 8));
              }
              scene_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_17d0);
              goto LAB_00482ed5;
            }
            pvVar31 = ::std::
                      vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                      ::operator[](&pRStack_18->images,(size_type)local_1658);
            ::std::__cxx11::string::string(local_1880,(string *)pvVar31);
            uVar6 = ::std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              poVar5 = ::std::operator<<(aoStack_1b8,"map_Ks ");
              poVar5 = ::std::operator<<(poVar5,local_1880);
              ::std::operator<<(poVar5,"\n");
              bVar4 = false;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_19f8);
              poVar5 = ::std::operator<<((ostream *)local_19f8,"[error]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"export_to_obj");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xfa);
              ::std::operator<<(poVar5," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_1a38,"Filename for image id {} is empty.",&local_1a39);
              fmt::format<long>(&local_1a18,&local_1a38,(long *)local_1658);
              poVar5 = ::std::operator<<((ostream *)local_19f8,(string *)&local_1a18);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::~string((string *)&local_1a18);
              ::std::__cxx11::string::~string((string *)&local_1a38);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_1a39);
              if (local_40 != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(&local_1a60,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(col_1._M_elems + 1),"\n");
                ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_1a60);
                ::std::__cxx11::string::~string((string *)&local_1a60);
                ::std::__cxx11::string::~string((string *)(col_1._M_elems + 1));
              }
              scene_local._7_1_ = 0;
              bVar4 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_19f8);
            }
            ::std::__cxx11::string::~string(local_1880);
            if (bVar4) goto LAB_00482ed5;
          }
          else {
            pvVar29 = ::std::
                      vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                      ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
            _auStack_1a8c = *(undefined8 *)(pvVar29->surfaceShader).specularColor.value._M_elems;
            col_1._M_elems[0] = (pvVar29->surfaceShader).specularColor.value._M_elems[2];
            poVar5 = ::std::operator<<(aoStack_1b8,"Ks ");
            pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)auStack_1a8c,0);
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
            poVar5 = ::std::operator<<(poVar5," ");
            pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)auStack_1a8c,1);
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
            poVar5 = ::std::operator<<(poVar5," ");
            pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)auStack_1a8c,2);
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
            ::std::operator<<(poVar5,"\n");
          }
        }
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        bVar4 = ShaderParam<float>::is_texture(&(pvVar29->surfaceShader).roughness);
        if (bVar4) {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          iVar3 = (pvVar29->surfaceShader).roughness.texture_id;
          local_20d0._0_4_ = iVar3;
          if ((iVar3 < 0) ||
             (sVar7 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
            ::std::__cxx11::ostringstream::ostringstream(local_2248);
            poVar5 = ::std::operator<<((ostream *)local_2248,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x11c);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_2288,"Invalid texture id {}. scene.textures.size = {}",&local_2289);
            local_2298 = ::std::
                         vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ::size(&pRStack_18->textures);
            fmt::format<int,unsigned_long>
                      (&local_2268,(fmt *)local_2288,(string *)local_20d0,(int *)&local_2298,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_2248,(string *)&local_2268);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_2268);
            ::std::__cxx11::string::~string(local_2288);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2289);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_22b8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imageId_3,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_22b8);
              ::std::__cxx11::string::~string((string *)&local_22b8);
              ::std::__cxx11::string::~string((string *)&imageId_3);
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_2248);
            goto LAB_00482ed5;
          }
          pvVar30 = ::std::
                    vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                    ::operator[](&pRStack_18->textures,(long)(int)local_20d0._0_4_);
          sVar7 = pvVar30->texture_image_id;
          local_22e0 = (undefined1  [8])sVar7;
          if (((long)sVar7 < 0) ||
             (sVar10 = ::std::
                       vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                       ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
            ::std::__cxx11::ostringstream::ostringstream(local_2458);
            poVar5 = ::std::operator<<((ostream *)local_2458,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x121);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_2498,"Invalid image id {}. scene.images.size = {}",&local_2499);
            local_24a8 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images);
            fmt::format<long,unsigned_long>
                      (&local_2478,(fmt *)local_2498,(string *)local_22e0,(long *)&local_24a8,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_2458,(string *)&local_2478);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_2478);
            ::std::__cxx11::string::~string(local_2498);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2499);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_24c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&texname_3.field_2 + 8),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_24c8);
              ::std::__cxx11::string::~string((string *)&local_24c8);
              ::std::__cxx11::string::~string((string *)(texname_3.field_2._M_local_buf + 8));
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_2458);
            goto LAB_00482ed5;
          }
          pvVar31 = ::std::
                    vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                    ::operator[](&pRStack_18->images,(size_type)local_22e0);
          ::std::__cxx11::string::string(local_2508,(string *)pvVar31);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar5 = ::std::operator<<(aoStack_1b8,"map_Pr ");
            poVar5 = ::std::operator<<(poVar5,local_2508);
            ::std::operator<<(poVar5,"\n");
            bVar4 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_2680);
            poVar5 = ::std::operator<<((ostream *)local_2680,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x126);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_26c0,"Filename for image id {} is empty.",&local_26c1);
            fmt::format<long>(&local_26a0,&local_26c0,(long *)local_22e0);
            poVar5 = ::std::operator<<((ostream *)local_2680,(string *)&local_26a0);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_26a0);
            ::std::__cxx11::string::~string((string *)&local_26c0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_26c1);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_26e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &texId_4,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_26e8);
              ::std::__cxx11::string::~string((string *)&local_26e8);
              ::std::__cxx11::string::~string((string *)&texId_4);
            }
            scene_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_2680);
          }
          ::std::__cxx11::string::~string(local_2508);
          if (bVar4) goto LAB_00482ed5;
        }
        else {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          local_2710._4_4_ = (pvVar29->surfaceShader).roughness.value;
          poVar5 = ::std::operator<<(aoStack_1b8,"Pr ");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,(float)local_2710._4_4_);
          ::std::operator<<(poVar5,"\n");
        }
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        bVar4 = ShaderParam<std::array<float,_3UL>_>::is_texture
                          (&(pvVar29->surfaceShader).emissiveColor);
        if (bVar4) {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          iVar3 = (pvVar29->surfaceShader).emissiveColor.texture_id;
          local_2710._0_4_ = iVar3;
          if ((iVar3 < 0) ||
             (sVar7 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
            ::std::__cxx11::ostringstream::ostringstream(local_2888);
            poVar5 = ::std::operator<<((ostream *)local_2888,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x131);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_28c8,"Invalid texture id {}. scene.textures.size = {}",&local_28c9);
            local_28d8 = ::std::
                         vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ::size(&pRStack_18->textures);
            fmt::format<int,unsigned_long>
                      (&local_28a8,(fmt *)local_28c8,(string *)local_2710,(int *)&local_28d8,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_2888,(string *)&local_28a8);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_28a8);
            ::std::__cxx11::string::~string(local_28c8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_28c9);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_28f8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imageId_4,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_28f8);
              ::std::__cxx11::string::~string((string *)&local_28f8);
              ::std::__cxx11::string::~string((string *)&imageId_4);
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_2888);
            goto LAB_00482ed5;
          }
          pvVar30 = ::std::
                    vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                    ::operator[](&pRStack_18->textures,(long)(int)local_2710._0_4_);
          sVar7 = pvVar30->texture_image_id;
          local_2920 = (undefined1  [8])sVar7;
          if (((long)sVar7 < 0) ||
             (sVar10 = ::std::
                       vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                       ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
            ::std::__cxx11::ostringstream::ostringstream(local_2a98);
            poVar5 = ::std::operator<<((ostream *)local_2a98,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x136);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_2ad8,"Invalid image id {}. scene.images.size = {}",&local_2ad9);
            local_2ae8 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images);
            fmt::format<long,unsigned_long>
                      (&local_2ab8,(fmt *)local_2ad8,(string *)local_2920,(long *)&local_2ae8,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_2a98,(string *)&local_2ab8);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_2ab8);
            ::std::__cxx11::string::~string(local_2ad8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2ad9);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_2b08,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&texname_4.field_2 + 8),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_2b08);
              ::std::__cxx11::string::~string((string *)&local_2b08);
              ::std::__cxx11::string::~string((string *)(texname_4.field_2._M_local_buf + 8));
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_2a98);
            goto LAB_00482ed5;
          }
          pvVar31 = ::std::
                    vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                    ::operator[](&pRStack_18->images,(size_type)local_2920);
          ::std::__cxx11::string::string(local_2b48,(string *)pvVar31);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar5 = ::std::operator<<(aoStack_1b8,"map_Ke ");
            poVar5 = ::std::operator<<(poVar5,local_2b48);
            ::std::operator<<(poVar5,"\n");
            bVar4 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_2cc0);
            poVar5 = ::std::operator<<((ostream *)local_2cc0,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x13b);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_2d00,"Filename for image id {} is empty.",&local_2d01);
            fmt::format<long>(&local_2ce0,&local_2d00,(long *)local_2920);
            poVar5 = ::std::operator<<((ostream *)local_2cc0,(string *)&local_2ce0);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_2ce0);
            ::std::__cxx11::string::~string((string *)&local_2d00);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2d01);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_2d28,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (col_2._M_elems + 1),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_2d28);
              ::std::__cxx11::string::~string((string *)&local_2d28);
              ::std::__cxx11::string::~string((string *)(col_2._M_elems + 1));
            }
            scene_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_2cc0);
          }
          ::std::__cxx11::string::~string(local_2b48);
          if (bVar4) goto LAB_00482ed5;
        }
        else {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          _auStack_2d54 = *(undefined8 *)(pvVar29->surfaceShader).emissiveColor.value._M_elems;
          col_2._M_elems[0] = (pvVar29->surfaceShader).emissiveColor.value._M_elems[2];
          poVar5 = ::std::operator<<(aoStack_1b8,"Ke ");
          pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)auStack_2d54,0);
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
          poVar5 = ::std::operator<<(poVar5," ");
          pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)auStack_2d54,1);
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
          poVar5 = ::std::operator<<(poVar5," ");
          pvVar9 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)auStack_2d54,2);
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,*pvVar9);
          ::std::operator<<(poVar5,"\n");
        }
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        bVar4 = ShaderParam<float>::is_texture(&(pvVar29->surfaceShader).opacity);
        if (bVar4) {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          iVar3 = (pvVar29->surfaceShader).opacity.texture_id;
          local_2d58 = (undefined1  [4])iVar3;
          if ((iVar3 < 0) ||
             (sVar7 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
            ::std::__cxx11::ostringstream::ostringstream(local_2ed0);
            poVar5 = ::std::operator<<((ostream *)local_2ed0,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x147);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_2f10,"Invalid texture id {}. scene.textures.size = {}",&local_2f11);
            local_2f20 = ::std::
                         vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ::size(&pRStack_18->textures);
            fmt::format<int,unsigned_long>
                      (&local_2ef0,(fmt *)local_2f10,(string *)local_2d58,(int *)&local_2f20,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_2ed0,(string *)&local_2ef0);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_2ef0);
            ::std::__cxx11::string::~string(local_2f10);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2f11);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_2f40,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imageId_5,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_2f40);
              ::std::__cxx11::string::~string((string *)&local_2f40);
              ::std::__cxx11::string::~string((string *)&imageId_5);
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_2ed0);
            goto LAB_00482ed5;
          }
          pvVar30 = ::std::
                    vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                    ::operator[](&pRStack_18->textures,(long)(int)local_2d58);
          sVar7 = pvVar30->texture_image_id;
          local_2f68 = (undefined1  [8])sVar7;
          if (((long)sVar7 < 0) ||
             (sVar10 = ::std::
                       vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                       ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
            ::std::__cxx11::ostringstream::ostringstream(local_30e0);
            poVar5 = ::std::operator<<((ostream *)local_30e0,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x14c);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_3120,"Invalid image id {}. scene.images.size = {}",&local_3121);
            local_3130 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images);
            fmt::format<long,unsigned_long>
                      (&local_3100,(fmt *)local_3120,(string *)local_2f68,(long *)&local_3130,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_30e0,(string *)&local_3100);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_3100);
            ::std::__cxx11::string::~string(local_3120);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3121);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_3150,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&texname_5.field_2 + 8),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_3150);
              ::std::__cxx11::string::~string((string *)&local_3150);
              ::std::__cxx11::string::~string((string *)(texname_5.field_2._M_local_buf + 8));
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_30e0);
            goto LAB_00482ed5;
          }
          pvVar31 = ::std::
                    vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                    ::operator[](&pRStack_18->images,(size_type)local_2f68);
          ::std::__cxx11::string::string(local_3190,(string *)pvVar31);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar5 = ::std::operator<<(aoStack_1b8,"map_d ");
            poVar5 = ::std::operator<<(poVar5,local_3190);
            ::std::operator<<(poVar5,"\n");
            bVar4 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_3308);
            poVar5 = ::std::operator<<((ostream *)local_3308,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x151);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_3348,"Filename for image id {} is empty.",&local_3349);
            fmt::format<long>(&local_3328,&local_3348,(long *)local_2f68);
            poVar5 = ::std::operator<<((ostream *)local_3308,(string *)&local_3328);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_3328);
            ::std::__cxx11::string::~string((string *)&local_3348);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3349);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_3370,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &texId_6,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_3370);
              ::std::__cxx11::string::~string((string *)&local_3370);
              ::std::__cxx11::string::~string((string *)&texId_6);
            }
            scene_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_3308);
          }
          ::std::__cxx11::string::~string(local_3190);
          if (bVar4) goto LAB_00482ed5;
        }
        else {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          local_3398._4_4_ = (pvVar29->surfaceShader).opacity.value;
          poVar5 = ::std::operator<<(aoStack_1b8,"d ");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,(float)local_3398._4_4_);
          ::std::operator<<(poVar5,"\n");
        }
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        bVar4 = ShaderParam<float>::is_texture(&(pvVar29->surfaceShader).clearcoat);
        if (bVar4) {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          iVar3 = (pvVar29->surfaceShader).clearcoat.texture_id;
          local_3398._0_4_ = iVar3;
          if ((iVar3 < 0) ||
             (sVar7 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
            ::std::__cxx11::ostringstream::ostringstream(local_3510);
            poVar5 = ::std::operator<<((ostream *)local_3510,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x15d);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_3550,"Invalid texture id {}. scene.textures.size = {}",&local_3551);
            local_3560 = ::std::
                         vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ::size(&pRStack_18->textures);
            fmt::format<int,unsigned_long>
                      (&local_3530,(fmt *)local_3550,(string *)local_3398,(int *)&local_3560,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_3510,(string *)&local_3530);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_3530);
            ::std::__cxx11::string::~string(local_3550);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3551);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_3580,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imageId_6,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_3580);
              ::std::__cxx11::string::~string((string *)&local_3580);
              ::std::__cxx11::string::~string((string *)&imageId_6);
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_3510);
            goto LAB_00482ed5;
          }
          pvVar30 = ::std::
                    vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                    ::operator[](&pRStack_18->textures,(long)(int)local_3398._0_4_);
          sVar7 = pvVar30->texture_image_id;
          local_35a8 = (undefined1  [8])sVar7;
          if (((long)sVar7 < 0) ||
             (sVar10 = ::std::
                       vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                       ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
            ::std::__cxx11::ostringstream::ostringstream(local_3720);
            poVar5 = ::std::operator<<((ostream *)local_3720,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x162);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_3760,"Invalid image id {}. scene.images.size = {}",&local_3761);
            local_3770 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images);
            fmt::format<long,unsigned_long>
                      (&local_3740,(fmt *)local_3760,(string *)local_35a8,(long *)&local_3770,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_3720,(string *)&local_3740);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_3740);
            ::std::__cxx11::string::~string(local_3760);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3761);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_3790,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&texname_6.field_2 + 8),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_3790);
              ::std::__cxx11::string::~string((string *)&local_3790);
              ::std::__cxx11::string::~string((string *)(texname_6.field_2._M_local_buf + 8));
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_3720);
            goto LAB_00482ed5;
          }
          pvVar31 = ::std::
                    vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                    ::operator[](&pRStack_18->images,(size_type)local_35a8);
          ::std::__cxx11::string::string(local_37d0,(string *)pvVar31);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar5 = ::std::operator<<(aoStack_1b8,"map_Pc ");
            poVar5 = ::std::operator<<(poVar5,local_37d0);
            ::std::operator<<(poVar5,"\n");
            bVar4 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_3948);
            poVar5 = ::std::operator<<((ostream *)local_3948,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x167);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_3988,"Filename for image id {} is empty.",&local_3989);
            fmt::format<long>(&local_3968,&local_3988,(long *)local_35a8);
            poVar5 = ::std::operator<<((ostream *)local_3948,(string *)&local_3968);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_3968);
            ::std::__cxx11::string::~string((string *)&local_3988);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3989);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_39b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &texId_7,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_39b0);
              ::std::__cxx11::string::~string((string *)&local_39b0);
              ::std::__cxx11::string::~string((string *)&texId_7);
            }
            scene_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_3948);
          }
          ::std::__cxx11::string::~string(local_37d0);
          if (bVar4) goto LAB_00482ed5;
        }
        else {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          local_39d8._4_4_ = (pvVar29->surfaceShader).clearcoat.value;
          poVar5 = ::std::operator<<(aoStack_1b8,"Pc ");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,(float)local_39d8._4_4_);
          ::std::operator<<(poVar5,"\n");
        }
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        bVar4 = ShaderParam<float>::is_texture(&(pvVar29->surfaceShader).clearcoatRoughness);
        if (bVar4) {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          iVar3 = (pvVar29->surfaceShader).clearcoatRoughness.texture_id;
          local_39d8._0_4_ = iVar3;
          if ((iVar3 < 0) ||
             (sVar7 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
            ::std::__cxx11::ostringstream::ostringstream(local_3b50);
            poVar5 = ::std::operator<<((ostream *)local_3b50,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x172);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_3b90,"Invalid texture id {}. scene.textures.size = {}",&local_3b91);
            local_3ba0 = ::std::
                         vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ::size(&pRStack_18->textures);
            fmt::format<int,unsigned_long>
                      (&local_3b70,(fmt *)local_3b90,(string *)local_39d8,(int *)&local_3ba0,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_3b50,(string *)&local_3b70);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_3b70);
            ::std::__cxx11::string::~string(local_3b90);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3b91);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_3bc0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imageId_7,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_3bc0);
              ::std::__cxx11::string::~string((string *)&local_3bc0);
              ::std::__cxx11::string::~string((string *)&imageId_7);
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_3b50);
            goto LAB_00482ed5;
          }
          pvVar30 = ::std::
                    vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                    ::operator[](&pRStack_18->textures,(long)(int)local_39d8._0_4_);
          sVar7 = pvVar30->texture_image_id;
          local_3be8 = (undefined1  [8])sVar7;
          if (((long)sVar7 < 0) ||
             (sVar10 = ::std::
                       vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                       ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
            ::std::__cxx11::ostringstream::ostringstream(local_3d60);
            poVar5 = ::std::operator<<((ostream *)local_3d60,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x177);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_3da0,"Invalid image id {}. scene.images.size = {}",&local_3da1);
            local_3db0 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images);
            fmt::format<long,unsigned_long>
                      (&local_3d80,(fmt *)local_3da0,(string *)local_3be8,(long *)&local_3db0,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_3d60,(string *)&local_3d80);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_3d80);
            ::std::__cxx11::string::~string(local_3da0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3da1);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_3dd0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&texname_7.field_2 + 8),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_3dd0);
              ::std::__cxx11::string::~string((string *)&local_3dd0);
              ::std::__cxx11::string::~string((string *)(texname_7.field_2._M_local_buf + 8));
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_3d60);
            goto LAB_00482ed5;
          }
          pvVar31 = ::std::
                    vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                    ::operator[](&pRStack_18->images,(size_type)local_3be8);
          ::std::__cxx11::string::string(local_3e10,(string *)pvVar31);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar5 = ::std::operator<<(aoStack_1b8,"map_Pcr ");
            poVar5 = ::std::operator<<(poVar5,local_3e10);
            ::std::operator<<(poVar5,"\n");
            bVar4 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_3f88);
            poVar5 = ::std::operator<<((ostream *)local_3f88,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x17c);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_3fc8,"Filename for image id {} is empty.",&local_3fc9);
            fmt::format<long>(&local_3fa8,&local_3fc8,(long *)local_3be8);
            poVar5 = ::std::operator<<((ostream *)local_3f88,(string *)&local_3fa8);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_3fa8);
            ::std::__cxx11::string::~string((string *)&local_3fc8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_3fc9);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_3ff0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &texId_8,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_3ff0);
              ::std::__cxx11::string::~string((string *)&local_3ff0);
              ::std::__cxx11::string::~string((string *)&texId_8);
            }
            scene_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_3f88);
          }
          ::std::__cxx11::string::~string(local_3e10);
          if (bVar4) goto LAB_00482ed5;
        }
        else {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          local_4018._4_4_ = (pvVar29->surfaceShader).clearcoatRoughness.value;
          poVar5 = ::std::operator<<(aoStack_1b8,"Pcr ");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,(float)local_4018._4_4_);
          ::std::operator<<(poVar5,"\n");
        }
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        bVar4 = ShaderParam<float>::is_texture(&(pvVar29->surfaceShader).ior);
        if (bVar4) {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          iVar3 = (pvVar29->surfaceShader).ior.texture_id;
          local_4018._0_4_ = iVar3;
          if ((iVar3 < 0) ||
             (sVar7 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
            ::std::__cxx11::ostringstream::ostringstream(local_4190);
            poVar5 = ::std::operator<<((ostream *)local_4190,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x187);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_41d0,"Invalid texture id {}. scene.textures.size = {}",&local_41d1);
            local_41e0 = ::std::
                         vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ::size(&pRStack_18->textures);
            fmt::format<int,unsigned_long>
                      (&local_41b0,(fmt *)local_41d0,(string *)local_4018,(int *)&local_41e0,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_4190,(string *)&local_41b0);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_41b0);
            ::std::__cxx11::string::~string(local_41d0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_41d1);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_4200,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imageId_8,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_4200);
              ::std::__cxx11::string::~string((string *)&local_4200);
              ::std::__cxx11::string::~string((string *)&imageId_8);
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_4190);
            goto LAB_00482ed5;
          }
          pvVar30 = ::std::
                    vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                    ::operator[](&pRStack_18->textures,(long)(int)local_4018._0_4_);
          sVar7 = pvVar30->texture_image_id;
          local_4228 = (undefined1  [8])sVar7;
          if (((long)sVar7 < 0) ||
             (sVar10 = ::std::
                       vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                       ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
            ::std::__cxx11::ostringstream::ostringstream(local_43a0);
            poVar5 = ::std::operator<<((ostream *)local_43a0,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x18c);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_43e0,"Invalid image id {}. scene.images.size = {}",&local_43e1);
            local_43f0 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images);
            fmt::format<long,unsigned_long>
                      (&local_43c0,(fmt *)local_43e0,(string *)local_4228,(long *)&local_43f0,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_43a0,(string *)&local_43c0);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_43c0);
            ::std::__cxx11::string::~string(local_43e0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_43e1);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_4410,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&texname_8.field_2 + 8),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_4410);
              ::std::__cxx11::string::~string((string *)&local_4410);
              ::std::__cxx11::string::~string((string *)(texname_8.field_2._M_local_buf + 8));
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_43a0);
            goto LAB_00482ed5;
          }
          pvVar31 = ::std::
                    vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                    ::operator[](&pRStack_18->images,(size_type)local_4228);
          ::std::__cxx11::string::string(local_4450,(string *)pvVar31);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar5 = ::std::operator<<(aoStack_1b8,"map_Ni ");
            poVar5 = ::std::operator<<(poVar5,local_4450);
            ::std::operator<<(poVar5,"\n");
            bVar4 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_45c8);
            poVar5 = ::std::operator<<((ostream *)local_45c8,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x191);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_4608,"Filename for image id {} is empty.",&local_4609);
            fmt::format<long>(&local_45e8,&local_4608,(long *)local_4228);
            poVar5 = ::std::operator<<((ostream *)local_45c8,(string *)&local_45e8);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_45e8);
            ::std::__cxx11::string::~string((string *)&local_4608);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_4609);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_4630,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &texId_9,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_4630);
              ::std::__cxx11::string::~string((string *)&local_4630);
              ::std::__cxx11::string::~string((string *)&texId_9);
            }
            scene_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_45c8);
          }
          ::std::__cxx11::string::~string(local_4450);
          if (bVar4) goto LAB_00482ed5;
        }
        else {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          local_4658._4_4_ = (pvVar29->surfaceShader).clearcoatRoughness.value;
          poVar5 = ::std::operator<<(aoStack_1b8,"Ni ");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,(float)local_4658._4_4_);
          ::std::operator<<(poVar5,"\n");
        }
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        bVar4 = ShaderParam<float>::is_texture(&(pvVar29->surfaceShader).occlusion);
        if (bVar4) {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          iVar3 = (pvVar29->surfaceShader).occlusion.texture_id;
          local_4658._0_4_ = iVar3;
          if ((iVar3 < 0) ||
             (sVar7 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
            ::std::__cxx11::ostringstream::ostringstream(local_47d0);
            poVar5 = ::std::operator<<((ostream *)local_47d0,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x19d);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_4810,"Invalid texture id {}. scene.textures.size = {}",&local_4811);
            local_4820 = ::std::
                         vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ::size(&pRStack_18->textures);
            fmt::format<int,unsigned_long>
                      (&local_47f0,(fmt *)local_4810,(string *)local_4658,(int *)&local_4820,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_47d0,(string *)&local_47f0);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_47f0);
            ::std::__cxx11::string::~string(local_4810);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_4811);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_4840,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imageId_9,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_4840);
              ::std::__cxx11::string::~string((string *)&local_4840);
              ::std::__cxx11::string::~string((string *)&imageId_9);
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_47d0);
            goto LAB_00482ed5;
          }
          pvVar30 = ::std::
                    vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                    ::operator[](&pRStack_18->textures,(long)(int)local_4658._0_4_);
          sVar7 = pvVar30->texture_image_id;
          local_4868 = (undefined1  [8])sVar7;
          if (((long)sVar7 < 0) ||
             (sVar10 = ::std::
                       vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                       ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
            ::std::__cxx11::ostringstream::ostringstream(local_49e0);
            poVar5 = ::std::operator<<((ostream *)local_49e0,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1a2);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_4a20,"Invalid image id {}. scene.images.size = {}",&local_4a21);
            local_4a30 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images);
            fmt::format<long,unsigned_long>
                      (&local_4a00,(fmt *)local_4a20,(string *)local_4868,(long *)&local_4a30,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_49e0,(string *)&local_4a00);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_4a00);
            ::std::__cxx11::string::~string(local_4a20);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_4a21);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_4a50,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&texname_9.field_2 + 8),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_4a50);
              ::std::__cxx11::string::~string((string *)&local_4a50);
              ::std::__cxx11::string::~string((string *)(texname_9.field_2._M_local_buf + 8));
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_49e0);
            goto LAB_00482ed5;
          }
          pvVar31 = ::std::
                    vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                    ::operator[](&pRStack_18->images,(size_type)local_4868);
          ::std::__cxx11::string::string(local_4a90,(string *)pvVar31);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar5 = ::std::operator<<(aoStack_1b8,"map_Ka ");
            poVar5 = ::std::operator<<(poVar5,local_4a90);
            ::std::operator<<(poVar5,"\n");
            bVar4 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_4c08);
            poVar5 = ::std::operator<<((ostream *)local_4c08,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1a7);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_4c48,"Filename for image id {} is empty.",&local_4c49);
            fmt::format<long>(&local_4c28,&local_4c48,(long *)local_4868);
            poVar5 = ::std::operator<<((ostream *)local_4c08,(string *)&local_4c28);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_4c28);
            ::std::__cxx11::string::~string((string *)&local_4c48);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_4c49);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_4c70,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &texId_10,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_4c70);
              ::std::__cxx11::string::~string((string *)&local_4c70);
              ::std::__cxx11::string::~string((string *)&texId_10);
            }
            scene_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_4c08);
          }
          ::std::__cxx11::string::~string(local_4a90);
          if (bVar4) goto LAB_00482ed5;
        }
        else {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          local_4c98._4_4_ = (pvVar29->surfaceShader).occlusion.value;
          poVar5 = ::std::operator<<(aoStack_1b8,"Ka ");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,(float)local_4c98._4_4_);
          ::std::operator<<(poVar5,"\n");
        }
        pvVar29 = ::std::
                  vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                  ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
        bVar4 = ShaderParam<float>::is_texture(&(pvVar29->surfaceShader).ior);
        if (bVar4) {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          iVar3 = (pvVar29->surfaceShader).ior.texture_id;
          local_4c98._0_4_ = iVar3;
          if ((iVar3 < 0) ||
             (sVar7 = ::std::
                      vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                      ::size(&pRStack_18->textures), (int)sVar7 <= iVar3)) {
            ::std::__cxx11::ostringstream::ostringstream(local_4e10);
            poVar5 = ::std::operator<<((ostream *)local_4e10,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1b3);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_4e50,"Invalid texture id {}. scene.textures.size = {}",&local_4e51);
            local_4e60 = ::std::
                         vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                         ::size(&pRStack_18->textures);
            fmt::format<int,unsigned_long>
                      (&local_4e30,(fmt *)local_4e50,(string *)local_4c98,(int *)&local_4e60,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_4e10,(string *)&local_4e30);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_4e30);
            ::std::__cxx11::string::~string(local_4e50);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_4e51);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_4e80,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &imageId_10,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_4e80);
              ::std::__cxx11::string::~string((string *)&local_4e80);
              ::std::__cxx11::string::~string((string *)&imageId_10);
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_4e10);
            goto LAB_00482ed5;
          }
          pvVar30 = ::std::
                    vector<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                    ::operator[](&pRStack_18->textures,(long)(int)local_4c98._0_4_);
          sVar7 = pvVar30->texture_image_id;
          local_4ea8 = (undefined1  [8])sVar7;
          if (((long)sVar7 < 0) ||
             (sVar10 = ::std::
                       vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                       ::size(&pRStack_18->images), (long)sVar10 <= (long)sVar7)) {
            ::std::__cxx11::ostringstream::ostringstream(local_5020);
            poVar5 = ::std::operator<<((ostream *)local_5020,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1b8);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_5060,"Invalid image id {}. scene.images.size = {}",&local_5061);
            local_5070 = ::std::
                         vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                         ::size(&pRStack_18->images);
            fmt::format<long,unsigned_long>
                      (&local_5040,(fmt *)local_5060,(string *)local_4ea8,(long *)&local_5070,
                       (unsigned_long *)warn);
            poVar5 = ::std::operator<<((ostream *)local_5020,(string *)&local_5040);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_5040);
            ::std::__cxx11::string::~string(local_5060);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_5061);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_5090,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&texname_10.field_2 + 8),"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_5090);
              ::std::__cxx11::string::~string((string *)&local_5090);
              ::std::__cxx11::string::~string((string *)(texname_10.field_2._M_local_buf + 8));
            }
            scene_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_5020);
            goto LAB_00482ed5;
          }
          pvVar31 = ::std::
                    vector<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                    ::operator[](&pRStack_18->images,(size_type)local_4ea8);
          ::std::__cxx11::string::string(local_50d0,(string *)pvVar31);
          uVar6 = ::std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            poVar5 = ::std::operator<<(aoStack_1b8,"map_Ni ");
            poVar5 = ::std::operator<<(poVar5,local_50d0);
            ::std::operator<<(poVar5,"\n");
            bVar4 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_5248);
            poVar5 = ::std::operator<<((ostream *)local_5248,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"export_to_obj");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1bd);
            ::std::operator<<(poVar5," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_5288,"Filename for image id {} is empty.",&local_5289);
            fmt::format<long>(&local_5268,&local_5288,(long *)local_4ea8);
            poVar5 = ::std::operator<<((ostream *)local_5248,(string *)&local_5268);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::~string((string *)&local_5268);
            ::std::__cxx11::string::~string((string *)&local_5288);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_5289);
            if (local_40 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(&local_52b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_52d0,"\n");
              ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_52b0);
              ::std::__cxx11::string::~string((string *)&local_52b0);
              ::std::__cxx11::string::~string((string *)local_52d0);
            }
            scene_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_5248);
          }
          ::std::__cxx11::string::~string(local_50d0);
          if (bVar4) goto LAB_00482ed5;
        }
        else {
          pvVar29 = ::std::
                    vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                    ::operator[](&pRStack_18->materials,(ulong)(uint)local_e00._4_4_);
          local_52d4 = (pvVar29->surfaceShader).clearcoatRoughness.value;
          poVar5 = ::std::operator<<(aoStack_1b8,"Ni ");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,local_52d4);
          ::std::operator<<(poVar5,"\n");
        }
        ::std::operator<<(aoStack_1b8,"\n");
      }
      ::std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_false,_true>
      ::operator++(&__end2_1);
    }
    poVar5 = ::std::operator<<(aoStack_1b8,"# ");
    sVar32 = ::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                     *)&subset_face_ids._M_h._M_single_bucket);
    poVar5 = (ostream *)::std::ostream::operator<<(poVar5,sVar32);
    ::std::operator<<(poVar5," materials.\n");
    ::std::__cxx11::stringstream::str();
    ::std::__cxx11::string::operator=((string *)warn_local,local_52f8);
    ::std::__cxx11::string::~string(local_52f8);
    scene_local._7_1_ = 1;
LAB_00482ed5:
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d20);
  }
  else {
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&__range3);
    this = &local_598->material_subsetMap;
    __end3 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>_>
             ::begin(this);
    subset = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>
              *)::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>_>
                ::end(this);
    while (bVar4 = ::std::operator!=(&__end3,(_Self *)&subset), bVar4) {
      face_ids_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)::std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>
                    ::operator*(&__end3);
      pvVar18 = MaterialSubset::indices
                          (&((reference)
                            face_ids_1.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage)->second);
      sVar7 = ::std::vector<int,_std::allocator<int>_>::size(pvVar18);
      ::std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i_4 + 7));
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a28,sVar7,
                 (allocator_type *)((long)&i_4 + 7));
      ::std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i_4 + 7));
      local_a38 = 0;
      while( true ) {
        pvVar18 = MaterialSubset::indices
                            ((MaterialSubset *)
                             (face_ids_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 8));
        sVar7 = ::std::vector<int,_std::allocator<int>_>::size(pvVar18);
        if (sVar7 <= local_a38) break;
        pvVar18 = MaterialSubset::indices
                            ((MaterialSubset *)
                             (face_ids_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 8));
        pvVar19 = (value_type *)
                  ::std::vector<int,_std::allocator<int>_>::operator[](pvVar18,local_a38);
        vVar2 = *pvVar19;
        pvVar20 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a28,
                             local_a38);
        *pvVar20 = vVar2;
        pvVar20 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a28,
                             local_a38);
        ::std::
        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)&__range3,pvVar20);
        local_a38 = local_a38 + 1;
      }
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        ::std::make_pair<int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>&>
                  ((pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,
                   (int *)(face_ids_1.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 0x22),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a28);
        pmVar23 = ::std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                *)&subset_face_ids._M_h._M_single_bucket,
                               (key_type *)
                               face_ids_1.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator=
                  (pmVar23,(type)&face_ids.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~pair
                  ((pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &face_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        bVar4 = false;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_bc0);
        poVar5 = ::std::operator<<((ostream *)local_bc0,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/obj-export.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"export_to_obj");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x7c);
        ::std::operator<<(poVar5," ");
        poVar5 = ::std::operator<<((ostream *)local_bc0,"Empty material_subset name is not allowed."
                                  );
        ::std::operator<<(poVar5,"\n");
        if (local_40 != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(&local_be0,&local_c00,"\n");
          ::std::__cxx11::string::operator+=((string *)local_40,(string *)&local_be0);
          ::std::__cxx11::string::~string((string *)&local_be0);
          ::std::__cxx11::string::~string((string *)&local_c00);
        }
        scene_local._7_1_ = 0;
        bVar4 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_bc0);
      }
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a28);
      if (bVar4) goto LAB_0047dc2a;
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialSubset>_>
      ::operator++(&__end3);
    }
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_5);
    local_c40 = 0;
    while( true ) {
      uVar6 = local_c40;
      pvVar21 = RenderMesh::faceVertexCounts(local_598);
      sVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar21);
      if (sVar7 <= uVar6) break;
      local_c44 = (key_type)local_c40;
      sVar22 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&__range3,&local_c44);
      if (sVar22 == 0) {
        local_c48 = (value_type_conflict3)local_c40;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_5,&local_c48);
      }
      local_c40 = local_c40 + 1;
    }
    ::std::make_pair<int_const&,std::vector<unsigned_int,std::allocator<unsigned_int>>&>
              (&local_c68,&local_598->material_id,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_5);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_c88,"",
               (allocator *)
               ((long)&face_ids_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pmVar23 = ::std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            *)&subset_face_ids._M_h._M_single_bucket,&local_c88);
    ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator=
              (pmVar23,&local_c68);
    ::std::__cxx11::string::~string((string *)&local_c88);
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&face_ids_2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    ::std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~pair(&local_c68);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_5);
    bVar4 = false;
LAB_0047dc2a:
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&__range3);
    if (!bVar4) goto LAB_0047dd6c;
  }
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    *)&subset_face_ids._M_h._M_single_bucket);
LAB_00482eed:
  ::std::__cxx11::stringstream::~stringstream(local_1c8);
  return (bool)(scene_local._7_1_ & 1);
}

Assistant:

bool export_to_obj(const RenderScene &scene, const int mesh_id,
  std::string &obj_str, std::string &mtl_str, std::string *warn, std::string *err) {

  //
  // NOTE:
  //
  // - Export GeomSubset(per-face material) as group(g) + usemtl
  // - Export skin weight as tinyobjloader's 'vw' extension
  //

  (void)obj_str;
  (void)mtl_str;
  (void)warn;

  std::stringstream ss;

  if (mesh_id < 0) {
    PUSH_ERROR_AND_RETURN("Invalid mesh_id");
  } else if (size_t(mesh_id) >= scene.meshes.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("mesh_id {} is out-of-range. scene.meshes.size {}", mesh_id, scene.meshes.size()));
  }

  const RenderMesh &mesh = scene.meshes[size_t(mesh_id)];

  ss << "# exported from TinyUSDZ Tydra.\n";
  ss << "mtllib " << mesh_id << mesh.prim_name + ".mtl";
  ss << "\n";
  
  for (size_t i = 0; i < mesh.points.size(); i++) {
    ss << "v " << mesh.points[i][0] << " " << mesh.points[i][1] << " " << mesh.points[i][2] << "\n";
  } 
  ss << "# " << mesh.points.size() << " vertices\n";

  if (mesh.joint_and_weights.jointWeights.size() == (mesh.points.size() * size_t(mesh.joint_and_weights.elementSize))) {
     
    size_t elementSize = size_t(mesh.joint_and_weights.elementSize); // # of weights per vertex.
    for (size_t i = 0; i < mesh.points.size(); i++) {
      ss << "vw ";
      for (size_t w = 0; w < elementSize; w++) {
        if (w > 0) {
          ss << " ";
        }
        ss << mesh.joint_and_weights.jointIndices[i * elementSize + w] << " " << mesh.joint_and_weights.jointWeights[i * elementSize + w];
      } 
      ss << "\n";
    }
  }

  bool has_texcoord = false;
  bool is_facevarying_texcoord = false;
  bool has_normal = false;
  bool is_facevarying_normal = false;

  // primary texcoord only
  if (mesh.texcoords.count(0)) {
    const VertexAttribute &texcoord = mesh.texcoords.at(0);  
    if (texcoord.variability == VertexVariability::FaceVarying) {
      is_facevarying_texcoord = true;
    } else if (texcoord.variability == VertexVariability::Vertex) {
      is_facevarying_texcoord = false;
    } else {
      PUSH_ERROR_AND_RETURN("Vertex variability must be either 'vertex' or 'facevarying' for texcoord0");
    }
    if (texcoord.format == VertexAttributeFormat::Vec2) {
      const float *ptr = reinterpret_cast<const float *>(texcoord.buffer());
      for (size_t i = 0; i < texcoord.vertex_count(); i++) {
        ss << "vt " << ptr[2 * i + 0] << " " << ptr[2 * i + 1] << "\n";
      } 

      has_texcoord = true;
    }
  }

  if (!mesh.normals.empty()) {
    if (mesh.normals.variability == VertexVariability::FaceVarying) {
      is_facevarying_normal = true;
    } else if (mesh.normals.variability == VertexVariability::Vertex) {
      is_facevarying_normal = false;
    } else {
      PUSH_ERROR_AND_RETURN("Vertex variability must be either 'vertex' or 'facevarying' for texcoord0");
    }
    if (mesh.normals.format == VertexAttributeFormat::Vec3) {
      const float *ptr = reinterpret_cast<const float *>(mesh.normals.buffer());
      for (size_t i = 0; i < mesh.normals.vertex_count(); i++) {
        ss << "vn " << ptr[3 * i + 0] << " " << ptr[3 * i + 1] << " " << ptr[3 * i + 2] << "\n";
      } 
      has_normal = true;
    }
  }

  // name -> (mat_id, face_ids)
  std::unordered_map<std::string, std::pair<int, std::vector<uint32_t>>> face_groups;
  if (mesh.material_subsetMap.size()) {

    std::unordered_set<uint32_t> subset_face_ids;

    for (const auto &subset : mesh.material_subsetMap) {
      std::vector<uint32_t> face_ids(subset.second.indices().size());
      for (size_t i = 0; i < subset.second.indices().size(); i++) {
        face_ids[i] = uint32_t(subset.second.indices()[i]); 
        subset_face_ids.insert(face_ids[i]);
      }
      if (subset.first.empty()) {
        PUSH_ERROR_AND_RETURN("Empty material_subset name is not allowed.");
      }
      face_groups[subset.first] = std::make_pair(subset.second.material_id, face_ids);
    }

    // face_ids without materialsubset
    std::vector<uint32_t> face_ids;
    for (size_t i = 0; i < mesh.faceVertexCounts().size(); i++) {
      if (!subset_face_ids.count(uint32_t(i))) {
        face_ids.push_back(uint32_t(i));
      }
    }
    face_groups[""] = std::make_pair(mesh.material_id, face_ids);
  } else {
    std::vector<uint32_t> face_ids(mesh.faceVertexCounts().size());
    std::iota(face_ids.begin(), face_ids.end(), 0);

    face_groups[""] = std::make_pair(mesh.material_id, face_ids);
  }

  // build face_id -> location in mesh.faceVertexIndices table.
  std::vector<size_t> offsets(mesh.faceVertexCounts().size());
  size_t offset = 0;
  for (size_t i = 0; i < mesh.faceVertexCounts().size(); i++) {
    offsets[i] = offset;
    offset += mesh.faceVertexCounts()[i];
  }

  size_t faceIndexOffset = 0;
  // Assume empty group name is iterated first.
  for (const auto &group : face_groups) {

    if (group.first.size()) {
      ss << "g " << group.first << "\n";
    }

    if (std::get<0>(group.second) > -1) {
      uint32_t mat_id = uint32_t(std::get<0>(group.second));
      ss << "usemtl " << scene.materials[mat_id].name << "\n";
    } 

    const auto &face_ids = std::get<1>(group.second);

    for (size_t i = 0; i < face_ids.size(); i++) {
      ss << "f ";

      for (size_t f = 0; f < mesh.faceVertexCounts()[face_ids[i]]; f++) {
        if (f > 0) {
          ss << " ";
        }
        // obj's index starts with 1.
        uint32_t idx = mesh.faceVertexIndices()[offsets[face_ids[i]] + f] + 1;

        uint32_t t_idx = is_facevarying_texcoord ? uint32_t(faceIndexOffset + f) : idx;
        uint32_t n_idx = is_facevarying_normal ? uint32_t(faceIndexOffset + f) : idx;

        if (has_texcoord && has_normal) {
          ss << idx << "/" << t_idx << "/" << n_idx;
        } else if (has_texcoord) {
          ss << idx << "/" << t_idx;
        } else if (has_normal) {
          ss << idx << "//" << n_idx;
        } else {
          ss << idx;
        }
      }

      faceIndexOffset += mesh.faceVertexIndices()[face_ids[i]];
      ss << "\n";
    }

    ss << "\n";
  }

  obj_str = ss.str();

  ss.str("");
  ss << "# exported from TinyUSDZ Tydra.\n";

  // emit material info
  for (const auto &group : face_groups) {
    if (group.second.first == -1) {
      continue;
    }

    uint32_t mat_id = uint32_t(std::get<0>(group.second));
    ss << "newmtl " << scene.materials[mat_id].name << "\n";

    // Original MTL spec: https://paulbourke.net/dataformats/mtl/
    // Emit PBR material: https://github.com/tinyobjloader/tinyobjloader/blob/release/pbr-mtl.md
    
    if (scene.materials[mat_id].surfaceShader.diffuseColor.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.diffuseColor.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Kd " << texname << "\n";
    } else {
      const auto col = scene.materials[mat_id].surfaceShader.diffuseColor.value;
      ss << "Kd " << col[0] << " " << col[1] << " " << col[2] << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.useSpecularWorkflow) {
      if (scene.materials[mat_id].surfaceShader.specularColor.is_texture()) {
        int32_t texId = scene.materials[mat_id].surfaceShader.specularColor.texture_id;
        if ((texId < 0) || (texId >= int(scene.textures.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
        }

        int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
        if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
        }

        std::string texname = scene.images[size_t(imageId)].asset_identifier;
        if (texname.empty()) {
          PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
        }
        ss << "map_Ks " << texname << "\n";
      } else {
        const auto col = scene.materials[mat_id].surfaceShader.specularColor.value;
        ss << "Ks " << col[0] << " " << col[1] << " " << col[2] << "\n";
      }
    } else {

      if (scene.materials[mat_id].surfaceShader.metallic.is_texture()) {
        int32_t texId = scene.materials[mat_id].surfaceShader.metallic.texture_id;
        if ((texId < 0) || (texId >= int(scene.textures.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
        }

        int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
        if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
          PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
        }

        std::string texname = scene.images[size_t(imageId)].asset_identifier;
        if (texname.empty()) {
          PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
        }
        ss << "map_Pm " << texname << "\n";
      } else {
        const auto f = scene.materials[mat_id].surfaceShader.metallic.value;
        ss << "Pm " << f << "\n";
      }
    }

    if (scene.materials[mat_id].surfaceShader.roughness.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.roughness.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pr " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.roughness.value;
      ss << "Pr " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.emissiveColor.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.emissiveColor.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Ke " << texname << "\n";
    } else {
      const auto col = scene.materials[mat_id].surfaceShader.emissiveColor.value;
      ss << "Ke " << col[0] << " " << col[1] << " " << col[2] << "\n";
    }


    if (scene.materials[mat_id].surfaceShader.opacity.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.opacity.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_d " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.opacity.value;
      ss << "d " << f << "\n";
    }

    // emit as cleacoat thickness
    if (scene.materials[mat_id].surfaceShader.clearcoat.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.clearcoat.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pc " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoat.value;
      ss << "Pc " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.clearcoatRoughness.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.clearcoatRoughness.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      ss << "map_Pcr " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Pcr " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.ior.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.ior.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // map_Ni is not in original mtl definition
      ss << "map_Ni " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Ni " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.occlusion.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.occlusion.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // Use map_ao?
      ss << "map_Ka " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.occlusion.value;
      ss << "Ka " << f << "\n";
    }

    if (scene.materials[mat_id].surfaceShader.ior.is_texture()) {
      int32_t texId = scene.materials[mat_id].surfaceShader.ior.texture_id;
      if ((texId < 0) || (texId >= int(scene.textures.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid texture id {}. scene.textures.size = {}", texId, scene.textures.size()));
      }

      int64_t imageId = scene.textures[size_t(texId)].texture_image_id;
      if ((imageId < 0) || (imageId >= int64_t(scene.images.size()))) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid image id {}. scene.images.size = {}", imageId, scene.images.size()));
      }

      std::string texname = scene.images[size_t(imageId)].asset_identifier;
      if (texname.empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Filename for image id {} is empty.", imageId));
      }
      // map_Ni is not in original mtl definition
      ss << "map_Ni " << texname << "\n";
    } else {
      const auto f = scene.materials[mat_id].surfaceShader.clearcoatRoughness.value;
      ss << "Ni " << f << "\n";
    }

    // TODO: opacityThreshold

    ss << "\n";
  }
  ss << "# " << face_groups.size() << " materials.\n";

  mtl_str = ss.str();

  return true;
}